

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O3

void __thiscall FatSystem::readFile(FatSystem *this,uint cluster,uint size,FILE *f,bool deleted)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  FILE *__s;
  uint uVar4;
  uint uVar5;
  ulong extraout_RAX;
  long lVar7;
  undefined3 in_register_00000081;
  char *buffer;
  undefined1 auStack_58 [8];
  undefined1 *local_50;
  FILE *local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  ulong uVar6;
  
  local_38 = CONCAT31(in_register_00000081,deleted);
  local_50 = auStack_58;
  local_48 = (FILE *)f;
  if (f == (FILE *)0x0) {
    local_48 = _stdout;
  }
  local_34 = local_38;
  if (cluster != 0xffffffff && size != 0) {
    do {
      uVar6 = this->bytesPerCluster;
      uVar5 = size;
      if (uVar6 < (ulong)(long)(int)size) {
        uVar5 = (uint)uVar6;
      }
      buffer = local_50 + -(uVar6 + 0xf & 0xfffffffffffffff0);
      uVar1 = this->bytesPerSector;
      uVar2 = this->sectorsPerCluster;
      uVar3 = this->dataStart;
      lVar7 = this->rootEntries << 5;
      if (this->type != 1) {
        lVar7 = 0;
      }
      buffer[-8] = '%';
      buffer[-7] = -0x1e;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      readData(this,lVar7 + (cluster - 2) * uVar1 * uVar2 + uVar3,buffer,uVar5);
      __s = local_48;
      uVar4 = size - uVar5;
      if (size == 0xffffffff) {
        uVar4 = size;
      }
      size = uVar4;
      buffer[-8] = 'L';
      buffer[-7] = -0x1e;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fwrite(buffer,(long)(int)uVar5,1,__s);
      buffer[-8] = 'T';
      buffer[-7] = -0x1e;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fflush(__s);
      if ((local_34 & 1) == 0) {
        buffer[-8] = -0x7d;
        buffer[-7] = -0x1e;
        buffer[-6] = '\x10';
        buffer[-5] = '\0';
        buffer[-4] = '\0';
        buffer[-3] = '\0';
        buffer[-2] = '\0';
        buffer[-1] = '\0';
        cluster = nextCluster(this,cluster,0);
        if (cluster == 0) {
          buffer[-8] = -0x33;
          buffer[-7] = -0x1e;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          readFile();
          uVar6 = extraout_RAX;
          cluster = local_3c;
          goto LAB_0010e2a7;
        }
        local_34 = 0;
      }
      else {
        if ((char)local_38 == '\0') {
          buffer[-8] = -0x60;
          buffer[-7] = -0x1e;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          uVar5 = nextCluster(this,cluster,0);
          uVar6 = (ulong)uVar5;
          if (uVar5 != 0) {
            buffer[-8] = -0x1e;
            buffer[-7] = -0x1e;
            buffer[-6] = '\x10';
            buffer[-5] = '\0';
            buffer[-4] = '\0';
            buffer[-3] = '\0';
            buffer[-2] = '\0';
            buffer[-1] = '\0';
            readFile();
            local_34 = 0;
            cluster = local_40;
            goto LAB_0010e2ac;
          }
          cluster = cluster + 1;
        }
        else {
          do {
            cluster = cluster + 1;
            buffer[-8] = 'p';
            buffer[-7] = -0x1e;
            buffer[-6] = '\x10';
            buffer[-5] = '\0';
            buffer[-4] = '\0';
            buffer[-3] = '\0';
            buffer[-2] = '\0';
            buffer[-1] = '\0';
            uVar5 = nextCluster(this,cluster,0);
            uVar6 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
LAB_0010e2a7:
        local_34 = (uint)CONCAT71((int7)(uVar6 >> 8),1);
      }
LAB_0010e2ac:
    } while ((size != 0) && (cluster != 0xffffffff));
  }
  return;
}

Assistant:

void FatSystem::readFile(unsigned int cluster, unsigned int size, FILE *f, bool deleted)
{
    bool contiguous = deleted;

    if (f == NULL) {
        f = stdout;
    }

    while ((size!=0) && cluster!=FAT_LAST) {
        int currentCluster = cluster;
        int toRead = size;
        if (toRead > bytesPerCluster || size < 0) {
            toRead = bytesPerCluster;
        }
#ifndef __WIN__
        char buffer[bytesPerCluster];
#else
                char *buffer = new char[bytesPerCluster];
                __try
                {
#endif
        readData(clusterAddress(cluster), buffer, toRead);

        if (size != -1) {
            size -= toRead;
        }

        // Write file data to the given file
        fwrite(buffer, toRead, 1, f);
        fflush(f);

        if (contiguous) {
            if (deleted) {
                do {
                    cluster++;
                } while (!freeCluster(cluster));
            } else {
                if (!freeCluster(cluster)) {
                    fprintf(stderr, "! Contiguous file contains cluster that seems allocated\n");
                    fprintf(stderr, "! Trying to disable contiguous mode\n");
                    contiguous = false;
                    cluster = nextCluster(cluster);
                } else {
                    cluster++;
                }
            }
        } else {
            cluster = nextCluster(currentCluster);

            if (cluster == 0) {
                fprintf(stderr, "! One of your file's cluster is 0 (maybe FAT is broken, have a look to -2 and -m)\n");
                fprintf(stderr, "! Trying to enable contigous mode\n");
                contiguous = true;
                cluster = currentCluster+1;
            }
        }
#ifdef __WIN__
    }
    __finally
    {
        delete[] buffer;
    }
#endif
    }
}